

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset_function.cc
# Opt level: O0

VectorXd __thiscall
projects::ipdg_stokes::assemble::createOffsetFunction
          (assemble *this,shared_ptr<const_lf::mesh::Mesh> *mesh,MeshDataSet<bool> *boundary,
          DofHandler *dofh,
          function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *dirichlet_data,
          SparseMatrix<double,_0,_int> *A)

{
  double dVar1;
  Entity *entity;
  pointer this_00;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  int iVar5;
  uint uVar6;
  uint blockRows;
  element_type *peVar7;
  undefined4 extraout_var;
  reference ppEVar8;
  undefined4 extraout_var_00;
  reference ppEVar9;
  undefined4 extraout_var_01;
  CoeffReturnType pdVar10;
  undefined4 extraout_var_02;
  reference peVar11;
  Scalar *pSVar12;
  Index blockCols;
  Index extraout_RDX;
  Scalar SVar13;
  span<const_long,_18446744073709551615UL> sVar14;
  VectorXd VVar15;
  Type local_810;
  Type local_7d8;
  Product<Eigen::Block<const_Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_7a8;
  span<const_long,_18446744073709551615UL> local_770;
  Entity *local_760;
  Entity *node;
  undefined1 local_750 [4];
  size_type node_idx;
  undefined1 local_731;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_730;
  Type local_720;
  undefined1 local_6f0 [8];
  VectorXd offset_function_local;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  undefined1 local_488 [24];
  ConstColXpr local_470;
  ConstTransposeReturnType local_440;
  Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  local_410;
  element_type local_3d8;
  Entity *edge;
  undefined1 auStack_3c8 [4];
  int edge_idx;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> edges;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  Entity *cell;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  undefined1 local_340 [8];
  VectorXd rhs;
  SparseMatrix<double,_0,_int> Js;
  size_type i_1;
  size_type i;
  undefined1 local_2d0 [8];
  PiecewiseBoundaryNormalJumpAssembler element_matrix_provider;
  COOMatrix<double> J;
  shared_ptr<const_lf::mesh::Mesh> local_290;
  undefined1 local_280 [8];
  DynamicFEDofHandler boundary_edge_dofh;
  anon_class_8_1_69d70da8 local_160;
  shared_ptr<const_lf::mesh::Mesh> local_158;
  undefined1 local_148 [8];
  DynamicFEDofHandler boundary_node_dofh;
  SparseMatrix<double,_0,_int> *A_local;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *dirichlet_data_local;
  DofHandler *dofh_local;
  MeshDataSet<bool> *boundary_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  VectorXd *offset_function;
  
  boundary_node_dofh.dofs_._M_elems[2].super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)A;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_158,mesh);
  local_160.boundary = boundary;
  lf::assemble::DynamicFEDofHandler::
  DynamicFEDofHandler<projects::ipdg_stokes::assemble::createOffsetFunction(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::mesh::utils::MeshDataSet<bool>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,Eigen::SparseMatrix<double,0,int>const&)::__0>
            ((DynamicFEDofHandler *)local_148,&local_158,&local_160);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_158);
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_290,mesh);
  J.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boundary;
  lf::assemble::DynamicFEDofHandler::
  DynamicFEDofHandler<projects::ipdg_stokes::assemble::createOffsetFunction(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::mesh::utils::MeshDataSet<bool>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,Eigen::SparseMatrix<double,0,int>const&)::__1>
            ((DynamicFEDofHandler *)local_280,&local_290,
             (anon_class_8_1_69d70da8 *)
             &J.triplets_.
              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_290);
  sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_280);
  sVar4 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_148);
  lf::assemble::COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)&element_matrix_provider.boundary_,sVar3 + 1,sVar4 + 1);
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)&i_1,mesh);
  PiecewiseBoundaryNormalJumpAssembler::PiecewiseBoundaryNormalJumpAssembler
            ((PiecewiseBoundaryNormalJumpAssembler *)local_2d0,
             (shared_ptr<const_lf::mesh::Mesh> *)&i_1,boundary);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)&i_1);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_projects::ipdg_stokes::assemble::PiecewiseBoundaryNormalJumpAssembler>
            (0,(DofHandler *)local_148,(DofHandler *)local_280,
             (PiecewiseBoundaryNormalJumpAssembler *)local_2d0,
             (COOMatrix<double> *)&element_matrix_provider.boundary_);
  for (Js.m_data.m_allocatedSize._4_4_ = 0;
      sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_148),
      Js.m_data.m_allocatedSize._4_4_ < sVar3;
      Js.m_data.m_allocatedSize._4_4_ = Js.m_data.m_allocatedSize._4_4_ + 1) {
    sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_280);
    lf::assemble::COOMatrix<double>::AddToEntry
              ((COOMatrix<double> *)&element_matrix_provider.boundary_,(ulong)sVar3,
               (ulong)Js.m_data.m_allocatedSize._4_4_,1.0);
  }
  for (Js.m_data.m_allocatedSize._0_4_ = 0;
      sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_280),
      (uint)Js.m_data.m_allocatedSize < sVar3;
      Js.m_data.m_allocatedSize._0_4_ = (uint)Js.m_data.m_allocatedSize + 1) {
    sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_148);
    lf::assemble::COOMatrix<double>::AddToEntry
              ((COOMatrix<double> *)&element_matrix_provider.boundary_,
               (ulong)(uint)Js.m_data.m_allocatedSize,(ulong)sVar3,1.0);
  }
  lf::assemble::COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (COOMatrix<double> *)&element_matrix_provider.boundary_);
  sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_280);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&__range2,(ulong)(sVar3 + 1));
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_340,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&__range2);
  peVar7 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  iVar5 = (*peVar7->_vptr_Mesh[2])(peVar7,0);
  __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar5);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  cell = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while (bVar2 = __gnu_cxx::
                 operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                           (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                     *)&cell), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppEVar8 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    entity = *ppEVar8;
    ipdg_stokes::mesh::computeOutwardNormals
              ((Matrix<double,_2,_3,_0,_2,_3> *)&edges._M_extent,entity);
    iVar5 = (*entity->_vptr_Entity[1])(entity,1);
    _auStack_3c8 = (pointer)CONCAT44(extraout_var_00,iVar5);
    for (edge._4_4_ = 0; edge._4_4_ < 3; edge._4_4_ = edge._4_4_ + 1) {
      ppEVar9 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                          ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                           auStack_3c8,(long)edge._4_4_);
      local_3d8 = *ppEVar9;
      iVar5 = (**boundary->_vptr_MeshDataSet)(boundary,local_3d8);
      if ((*(byte *)CONCAT44(extraout_var_01,iVar5) & 1) != 0) {
        Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::col
                  (&local_470,(DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)&edges._M_extent,
                   (long)edge._4_4_);
        Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>::
        transpose(&local_440,
                  (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>
                   *)&local_470);
        std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>::operator()
                  ((function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *)
                   local_488,(Entity *)dirichlet_data);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>const,2,1,true>const>>
        ::operator*(&local_410,
                    (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>const,2,1,true>const>>
                     *)&local_440,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_488);
        SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                           ((dense_product_base *)&local_410);
        sVar14 = lf::assemble::DynamicFEDofHandler::GlobalDofIndices
                           ((DynamicFEDofHandler *)local_280,local_3d8);
        solver.m_detPermC = (Index)sVar14._M_ptr;
        peVar11 = std::span<const_long,_18446744073709551615UL>::operator[]
                            ((span<const_long,_18446744073709551615UL> *)&solver.m_detPermC,0);
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_340
                             ,*peVar11);
        *pSVar12 = SVar13;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &offset_function_local.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &offset_function_local.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,
             (MatrixType *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_730 = Eigen::
              SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
              ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                          *)&offset_function_local.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340);
  sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_148);
  Eigen::
  DenseBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::head<unsigned_int>
            (&local_720,
             (DenseBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_730,sVar3);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>const,_1,1,false>>
            ((Matrix<double,_1,1,0,_1,1> *)local_6f0,
             (EigenBase<Eigen::Block<const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1,_false>_>
              *)&local_720);
  local_731 = 0;
  uVar6 = (*dofh->_vptr_DofHandler[2])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)local_750,(ulong)uVar6);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_750);
  node._4_4_ = 0;
  while( true ) {
    uVar6 = node._4_4_;
    sVar3 = lf::assemble::DynamicFEDofHandler::NumDofs((DynamicFEDofHandler *)local_148);
    this_00 = boundary_node_dofh.dofs_._M_elems[2].super__Vector_base<long,_std::allocator<long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (sVar3 <= uVar6) break;
    local_760 = lf::assemble::DynamicFEDofHandler::Entity
                          ((DynamicFEDofHandler *)local_148,(ulong)node._4_4_);
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_6f0,
                         (ulong)node._4_4_);
    dVar1 = *pdVar10;
    iVar5 = (*dofh->_vptr_DofHandler[5])(dofh,local_760);
    local_770._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar5);
    peVar11 = std::span<const_long,_18446744073709551615UL>::operator[](&local_770,0);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,*peVar11
                        );
    *pSVar12 = dVar1;
    node._4_4_ = node._4_4_ + 1;
  }
  peVar7 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  uVar6 = (*peVar7->_vptr_Mesh[3])(peVar7,2);
  peVar7 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  blockRows = (*peVar7->_vptr_Mesh[3])(peVar7,1);
  blockCols = Eigen::SparseMatrix<double,_0,_int>::cols
                        ((SparseMatrix<double,_0,_int> *)
                         boundary_node_dofh.dofs_._M_elems[2].
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::block<unsigned_int,long>
            (&local_7d8,this_00,(ulong)uVar6,0,blockRows,blockCols);
  Eigen::SparseMatrixBase<Eigen::Block<Eigen::SparseMatrix<double,0,int>const,-1,-1,false>>::
  operator*(&local_7a8,
            (SparseMatrixBase<Eigen::Block<Eigen::SparseMatrix<double,0,int>const,_1,_1,false>> *)
            &local_7d8,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  peVar7 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  uVar6 = (*peVar7->_vptr_Mesh[3])(peVar7,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<unsigned_int>
            (&local_810,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,uVar6);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_810,
             (DenseBase<Eigen::Product<Eigen::Block<const_Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_7a8);
  local_731 = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_6f0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &offset_function_local.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_340);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  PiecewiseBoundaryNormalJumpAssembler::~PiecewiseBoundaryNormalJumpAssembler
            ((PiecewiseBoundaryNormalJumpAssembler *)local_2d0);
  lf::assemble::COOMatrix<double>::~COOMatrix
            ((COOMatrix<double> *)&element_matrix_provider.boundary_);
  lf::assemble::DynamicFEDofHandler::~DynamicFEDofHandler((DynamicFEDofHandler *)local_280);
  lf::assemble::DynamicFEDofHandler::~DynamicFEDofHandler((DynamicFEDofHandler *)local_148);
  VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd createOffsetFunction(
    const std::shared_ptr<const lf::mesh::Mesh> &mesh,
    const lf::mesh::utils::MeshDataSet<bool> &boundary,
    const lf::assemble::DofHandler &dofh,
    const std::function<Eigen::Vector2d(const lf::mesh::Entity &)>
        &dirichlet_data,
    const Eigen::SparseMatrix<double> &A) {
  // Create a new dofhandler for the boundary nodes of the mesh
  const lf::assemble::DynamicFEDofHandler boundary_node_dofh(
      mesh, [&](const lf::mesh::Entity &entity) {
        if (entity.RefEl() == lf::base::RefElType::kPoint && boundary(entity)) {
          return 1;
        }
        return 0;
      });
  // Create a new dofhandler for the boundary edges of the mesh
  const lf::assemble::DynamicFEDofHandler boundary_edge_dofh(
      mesh, [&](const lf::mesh::Entity &entity) {
        if (entity.RefEl() == lf::base::RefElType::kSegment &&
            boundary(entity)) {
          return 1;
        }
        return 0;
      });
  // Assemble a matrix mapping the basis function coefficients on the boundary
  // nodes to the normal jumps over the boundary edges
  lf::assemble::COOMatrix<double> J(boundary_edge_dofh.NumDofs() + 1,
                                    boundary_node_dofh.NumDofs() + 1);
  PiecewiseBoundaryNormalJumpAssembler element_matrix_provider(mesh, boundary);
  lf::assemble::AssembleMatrixLocally(0, boundary_node_dofh, boundary_edge_dofh,
                                      element_matrix_provider, J);
  // Add the lagrange multiplier needed such that the average over all
  // coefficients is zero
  for (lf::base::size_type i = 0; i < boundary_node_dofh.NumDofs(); ++i) {
    J.AddToEntry(boundary_edge_dofh.NumDofs(), i, 1);
  }
  for (lf::base::size_type i = 0; i < boundary_edge_dofh.NumDofs(); ++i) {
    J.AddToEntry(i, boundary_node_dofh.NumDofs(), 1);
  }
  const Eigen::SparseMatrix<double> Js = J.makeSparse();
  // Assemble the right hand side from the provided dirichlet data
  Eigen::VectorXd rhs = Eigen::VectorXd::Zero(boundary_edge_dofh.NumDofs() + 1);
  for (const auto *const cell : mesh->Entities(0)) {
    const Eigen::Matrix<double, 2, 3> normals =
        projects::ipdg_stokes::mesh::computeOutwardNormals(*cell);
    const auto edges = cell->SubEntities(1);
    for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
      const auto &edge = *edges[edge_idx];
      if (boundary(edge)) {
        rhs[boundary_edge_dofh.GlobalDofIndices(edge)[0]] =
            normals.col(edge_idx).transpose() * dirichlet_data(edge);
      }
    }
  }
  // Solve for the basis function coefficients of the offset function ordered
  // with the boundary dof handler
  Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
  solver.compute(Js);
  const Eigen::VectorXd offset_function_local =
      solver.solve(rhs).head(boundary_node_dofh.NumDofs());
  // Compute the full offset function including the jump terms
  Eigen::VectorXd offset_function = Eigen::VectorXd::Zero(dofh.NumDofs());
  for (lf::assemble::size_type node_idx = 0;
       node_idx < boundary_node_dofh.NumDofs(); ++node_idx) {
    const auto &node = boundary_node_dofh.Entity(node_idx);
    offset_function[dofh.GlobalDofIndices(node)[0]] =
        offset_function_local[node_idx];
  }
  offset_function.tail(mesh->NumEntities(1)) =
      A.block(mesh->NumEntities(2), 0, mesh->NumEntities(1), A.cols()) *
      offset_function;
  return offset_function;
}